

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<short>::emplace<short&>(QPodArrayOps<short> *this,qsizetype i,short *args)

{
  short sVar1;
  Data *pDVar2;
  long lVar3;
  short *psVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<short>).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar3 = (this->super_QArrayDataPointer<short>).size;
    if ((lVar3 == i) &&
       (psVar4 = (this->super_QArrayDataPointer<short>).ptr,
       (pDVar2->super_QArrayData).alloc !=
       ((long)((long)psVar4 -
              ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) +
       i)) {
      psVar4[i] = *args;
      (this->super_QArrayDataPointer<short>).size = i + 1;
      return;
    }
    if ((i == 0) &&
       (psVar4 = (this->super_QArrayDataPointer<short>).ptr,
       (short *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       psVar4)) {
      psVar4[-1] = *args;
      (this->super_QArrayDataPointer<short>).ptr = psVar4 + -1;
      (this->super_QArrayDataPointer<short>).size = lVar3 + 1;
      return;
    }
  }
  sVar1 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<short>).size != 0);
  QArrayDataPointer<short>::detachAndGrow
            (&this->super_QArrayDataPointer<short>,where,1,(short **)0x0,
             (QArrayDataPointer<short> *)0x0);
  psVar4 = createHole(this,where,i,1);
  *psVar4 = sVar1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }